

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

int HRSS_decap(uint8_t *out_shared_key,HRSS_private_key *in_priv,uint8_t *ciphertext,
              size_t ciphertext_len)

{
  uint8_t uVar1;
  int iVar2;
  POLY_MUL_SCRATCH *scratch;
  crypto_word_t cVar3;
  crypto_word_t cVar4;
  uint local_90;
  uint local_8c;
  uint i_3;
  uint i_2;
  crypto_word_t ok;
  size_t i_1;
  uint8_t inner_digest [32];
  ulong local_50;
  size_t i;
  vars *vars;
  void *malloc_ptr;
  private_key *priv;
  size_t ciphertext_len_local;
  uint8_t *ciphertext_local;
  HRSS_private_key *in_priv_local;
  uint8_t *out_shared_key_local;
  
  priv = (private_key *)ciphertext_len;
  ciphertext_len_local = (size_t)ciphertext;
  ciphertext_local = in_priv->opaque;
  in_priv_local = (HRSS_private_key *)out_shared_key;
  malloc_ptr = private_key_from_external(in_priv);
  scratch = (POLY_MUL_SCRATCH *)malloc_align32(&vars,0xb050);
  if (scratch == (POLY_MUL_SCRATCH *)0x0) {
    RAND_bytes(in_priv_local->opaque,0x20);
    out_shared_key_local._4_4_ = 0;
  }
  else {
    OPENSSL_memset(scratch,0xff,0xb050);
    for (local_50 = 0; local_50 < 0x20; local_50 = local_50 + 1) {
      scratch[1].u.rq[local_50] = *(byte *)((long)malloc_ptr + local_50 + 0x6e0) ^ 0x36;
    }
    OPENSSL_memset((void *)((long)&scratch[1].u + 0x20),0x36,0x20);
    SHA256_Init((SHA256_CTX *)((long)&scratch[1].u + 0x40));
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),scratch + 1,0x40);
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),(void *)ciphertext_len_local,
                  (size_t)priv);
    SHA256_Final((uchar *)&i_1,(SHA256_CTX *)((long)&scratch[1].u + 0x40));
    for (ok = 0; ok < 0x20; ok = ok + 1) {
      scratch[1].u.rq[ok] = scratch[1].u.rq[ok] ^ 0x6a;
    }
    OPENSSL_memset((void *)((long)&scratch[1].u + 0x20),0x5c,0x20);
    SHA256_Init((SHA256_CTX *)((long)&scratch[1].u + 0x40));
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),scratch + 1,0x40);
    SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),&i_1,0x20);
    SHA256_Final(in_priv_local->opaque,(SHA256_CTX *)((long)&scratch[1].u + 0x40));
    if ((priv == (private_key *)0x472) &&
       (iVar2 = poly_unmarshal((poly *)((long)&scratch[1].u + 0xb0),(uint8_t *)ciphertext_len_local)
       , iVar2 != 0)) {
      poly_from_poly3((poly *)((long)&scratch[1].u + 0x630),(poly3 *)malloc_ptr);
      poly_mul(scratch,(poly *)((long)&scratch[1].u + 0xbb0),(poly *)((long)&scratch[1].u + 0xb0),
               (poly *)((long)&scratch[1].u + 0x630));
      poly3_from_poly((poly3 *)((long)&scratch[1].u + 0x1130),(poly *)((long)&scratch[1].u + 0xbb0))
      ;
      HRSS_poly3_mul((poly3 *)((long)&scratch[1].u + 0x11e0),(poly3 *)((long)&scratch[1].u + 0x1130)
                     ,(poly3 *)((long)malloc_ptr + 0xb0));
      poly_from_poly3((poly *)((long)&scratch[1].u + 0x1290),(poly3 *)((long)&scratch[1].u + 0x11e0)
                     );
      poly_lift((poly *)((long)&scratch[1].u + 0x1810),(poly *)((long)&scratch[1].u + 0x1290));
      for (local_8c = 0; local_8c < 0x2bd; local_8c = local_8c + 1) {
        *(short *)((long)&scratch[1].u + (ulong)local_8c * 2 + 0x1d90) =
             *(short *)((long)&scratch[1].u + (ulong)local_8c * 2 + 0xb0) -
             *(short *)((long)&scratch[1].u + (ulong)local_8c * 2 + 0x1810);
      }
      poly_normalize((poly *)((long)&scratch[1].u + 0x1d90));
      poly_mul(scratch,(poly *)((long)&scratch[1].u + 0x1d90),(poly *)((long)&scratch[1].u + 0x1d90)
               ,(poly *)((long)malloc_ptr + 0x160));
      poly_mod_phiN((poly *)((long)&scratch[1].u + 0x1d90));
      poly_clamp((poly *)((long)&scratch[1].u + 0x1d90));
      cVar3 = poly3_from_poly_checked
                        ((poly3 *)((long)&scratch[1].u + 0x2310),
                         (poly *)((long)&scratch[1].u + 0x1d90));
      if (priv != (private_key *)0x472) {
        __assert_fail("ciphertext_len == sizeof(vars->expected_ciphertext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                      ,0x85e,
                      "int HRSS_decap(uint8_t *, const struct HRSS_private_key *, const uint8_t *, size_t)"
                     );
      }
      poly_marshal(scratch[1].u.rq + 0x23c0,(poly *)((long)&scratch[1].u + 0xb0));
      poly_marshal_mod3(scratch[1].u.rq + 0x2832,(poly *)((long)&scratch[1].u + 0x1290));
      poly_marshal_mod3(scratch[1].u.rq + 0x28be,(poly *)((long)&scratch[1].u + 0x1d90));
      iVar2 = CRYPTO_memcmp((void *)ciphertext_len_local,(void *)((long)&scratch[1].u + 0x23c0),
                            0x472);
      cVar4 = constant_time_is_zero_w((long)iVar2);
      SHA256_Init((SHA256_CTX *)((long)&scratch[1].u + 0x40));
      SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),"shared key",0xb);
      SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),
                    (void *)((long)&scratch[1].u + 0x2832),0x8c);
      SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),
                    (void *)((long)&scratch[1].u + 0x28be),0x8c);
      SHA256_Update((SHA256_CTX *)((long)&scratch[1].u + 0x40),
                    (void *)((long)&scratch[1].u + 0x23c0),0x472);
      SHA256_Final(scratch[1].u.rq + 0x294a,(SHA256_CTX *)((long)&scratch[1].u + 0x40));
      for (local_90 = 0; local_90 < 0x20; local_90 = local_90 + 1) {
        uVar1 = constant_time_select_8
                          (cVar4 & cVar3,scratch[1].u.rq[(ulong)local_90 + 0x294a],
                           in_priv_local->opaque[local_90]);
        in_priv_local->opaque[local_90] = uVar1;
      }
    }
    OPENSSL_free(vars);
    out_shared_key_local._4_4_ = 1;
  }
  return out_shared_key_local._4_4_;
}

Assistant:

int HRSS_decap(uint8_t out_shared_key[HRSS_KEY_BYTES],
               const struct HRSS_private_key *in_priv,
               const uint8_t *ciphertext, size_t ciphertext_len) {
  const struct private_key *priv =
      private_key_from_external((struct HRSS_private_key *)in_priv);

#if defined(_MSC_VER)
  // MSVC will produce this useless warning:
  // warning C4324: structure was padded due to alignment specifier
#pragma warning(push)
#pragma warning(disable : 4324)
#endif
  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    uint8_t masked_key[SHA256_CBLOCK];
    SHA256_CTX hash_ctx;
    struct poly c;
    struct poly f, cf;
    struct poly3 cf3, m3;
    struct poly m, m_lifted;
    struct poly r;
    struct poly3 r3;
    uint8_t expected_ciphertext[HRSS_CIPHERTEXT_BYTES];
    uint8_t m_bytes[HRSS_POLY3_BYTES];
    uint8_t r_bytes[HRSS_POLY3_BYTES];
    uint8_t shared_key[32];
  };
#if defined(_MSC_VER)
#pragma warning(pop)
#endif

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's used to encrypt and
    // transmit something.
    RAND_bytes(out_shared_key, HRSS_KEY_BYTES);
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  // This is HMAC, expanded inline rather than using the |HMAC| function so that
  // we can avoid dealing with possible allocation failures and so keep this
  // function infallible.
  static_assert(sizeof(priv->hmac_key) <= sizeof(vars->masked_key),
                "HRSS HMAC key larger than SHA-256 block size");
  for (size_t i = 0; i < sizeof(priv->hmac_key); i++) {
    vars->masked_key[i] = priv->hmac_key[i] ^ 0x36;
  }
  OPENSSL_memset(vars->masked_key + sizeof(priv->hmac_key), 0x36,
                 sizeof(vars->masked_key) - sizeof(priv->hmac_key));

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, vars->masked_key, sizeof(vars->masked_key));
  SHA256_Update(&vars->hash_ctx, ciphertext, ciphertext_len);
  uint8_t inner_digest[SHA256_DIGEST_LENGTH];
  SHA256_Final(inner_digest, &vars->hash_ctx);

  for (size_t i = 0; i < sizeof(priv->hmac_key); i++) {
    vars->masked_key[i] ^= (0x5c ^ 0x36);
  }
  OPENSSL_memset(vars->masked_key + sizeof(priv->hmac_key), 0x5c,
                 sizeof(vars->masked_key) - sizeof(priv->hmac_key));

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, vars->masked_key, sizeof(vars->masked_key));
  SHA256_Update(&vars->hash_ctx, inner_digest, sizeof(inner_digest));
  static_assert(HRSS_KEY_BYTES == SHA256_DIGEST_LENGTH,
                "HRSS shared key length incorrect");
  SHA256_Final(out_shared_key, &vars->hash_ctx);

  // If the ciphertext is publicly invalid then a random shared key is still
  // returned to simply the logic of the caller, but this path is not constant
  // time.
  crypto_word_t ok = 0;
  if (ciphertext_len != HRSS_CIPHERTEXT_BYTES ||
      !poly_unmarshal(&vars->c, ciphertext)) {
    goto out;
  }

  poly_from_poly3(&vars->f, &priv->f);
  poly_mul(&vars->scratch, &vars->cf, &vars->c, &vars->f);
  poly3_from_poly(&vars->cf3, &vars->cf);
  // Note that cf3 is not reduced mod Φ(N). That reduction is deferred.
  HRSS_poly3_mul(&vars->m3, &vars->cf3, &priv->f_inverse);

  poly_from_poly3(&vars->m, &vars->m3);
  poly_lift(&vars->m_lifted, &vars->m);

  for (unsigned i = 0; i < N; i++) {
    vars->r.v[i] = vars->c.v[i] - vars->m_lifted.v[i];
  }
  poly_normalize(&vars->r);
  poly_mul(&vars->scratch, &vars->r, &vars->r, &priv->ph_inverse);
  poly_mod_phiN(&vars->r);
  poly_clamp(&vars->r);

  ok = poly3_from_poly_checked(&vars->r3, &vars->r);

  // [NTRUCOMP] section 5.1 includes ReEnc2 and a proof that it's valid. Rather
  // than do an expensive |poly_mul|, it rebuilds |c'| from |c - lift(m)|
  // (called |b|) with:
  //   t = (−b(1)/N) mod Q
  //   c' = b + tΦ(N) + lift(m) mod Q
  //
  // When polynomials are transmitted, the final coefficient is omitted and
  // |poly_unmarshal| sets it such that f(1) == 0. Thus c(1) == 0. Also,
  // |poly_lift| multiplies the result by (x-1) and therefore evaluating a
  // lifted polynomial at 1 is also zero. Thus lift(m)(1) == 0 and so
  // (c - lift(m))(1) == 0.
  //
  // Although we defer the reduction above, |b| is conceptually reduced mod
  // Φ(N). In order to do that reduction one subtracts |c[N-1]| from every
  // coefficient. Therefore b(1) = -c[N-1]×N. The value of |t|, above, then is
  // just recovering |c[N-1]|, and adding tΦ(N) is simply undoing the reduction.
  // Therefore b + tΦ(N) + lift(m) = c by construction and we don't need to
  // recover |c| at all so long as we do the checks in
  // |poly3_from_poly_checked|.
  //
  // The |poly_marshal| here then is just confirming that |poly_unmarshal| is
  // strict and could be omitted.

  static_assert(HRSS_CIPHERTEXT_BYTES == POLY_BYTES,
                "ciphertext is the wrong size");
  assert(ciphertext_len == sizeof(vars->expected_ciphertext));
  poly_marshal(vars->expected_ciphertext, &vars->c);

  poly_marshal_mod3(vars->m_bytes, &vars->m);
  poly_marshal_mod3(vars->r_bytes, &vars->r);

  ok &= constant_time_is_zero_w(
      CRYPTO_memcmp(ciphertext, vars->expected_ciphertext,
                    sizeof(vars->expected_ciphertext)));

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, kSharedKey, sizeof(kSharedKey));
  SHA256_Update(&vars->hash_ctx, vars->m_bytes, sizeof(vars->m_bytes));
  SHA256_Update(&vars->hash_ctx, vars->r_bytes, sizeof(vars->r_bytes));
  SHA256_Update(&vars->hash_ctx, vars->expected_ciphertext,
                sizeof(vars->expected_ciphertext));
  SHA256_Final(vars->shared_key, &vars->hash_ctx);

  for (unsigned i = 0; i < sizeof(vars->shared_key); i++) {
    out_shared_key[i] =
        constant_time_select_8(ok, vars->shared_key[i], out_shared_key[i]);
  }

out:
  OPENSSL_free(malloc_ptr);
  return 1;
}